

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

void Bmc_MnaFree(Bmc_Mna_t *p)

{
  Bmc_Mna_t *p_local;
  
  Cnf_DataFree(p->pCnf);
  Vec_IntFreeP(&p->vPiMap);
  Vec_IntFreeP(&p->vId2Var);
  Vec_IntFreeP(&p->vInputs);
  Vec_IntFreeP(&p->vOutputs);
  Vec_IntFreeP(&p->vNodes);
  sat_solver_delete(p->pSat);
  if (p != (Bmc_Mna_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Bmc_MnaFree( Bmc_Mna_t * p )
{
    Cnf_DataFree( p->pCnf );
    Vec_IntFreeP( &p->vPiMap );
    Vec_IntFreeP( &p->vId2Var );
    Vec_IntFreeP( &p->vInputs );
    Vec_IntFreeP( &p->vOutputs );
    Vec_IntFreeP( &p->vNodes );
    sat_solver_delete( p->pSat );
    ABC_FREE( p );
}